

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::RecordFieldAccessStats
          (ScriptContext *this,FunctionBody *functionBody,FieldAccessStatsPtr fieldAccessStats)

{
  BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  FieldAccessStatsEntry *this_00;
  uint local_74;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  RecyclerWeakReference<Js::FunctionBody> *local_38;
  RecyclerWeakReference<Js::FunctionBody> *functionBodyWeakRef;
  FieldAccessStatsEntry *local_28;
  FieldAccessStatsEntry *entry;
  FieldAccessStatsPtr fieldAccessStats_local;
  FunctionBody *functionBody_local;
  ScriptContext *this_local;
  
  entry = (FieldAccessStatsEntry *)fieldAccessStats;
  fieldAccessStats_local = (FieldAccessStatsPtr)functionBody;
  functionBody_local = (FunctionBody *)this;
  if (fieldAccessStats == (FieldAccessStatsPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19a5,"(fieldAccessStats != nullptr)",
                                "fieldAccessStats != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,ObjTypeSpecPhase);
  if (bVar3) {
    pBVar1 = this->fieldAccessStatsByFunctionNumber;
    functionBodyWeakRef._4_4_ =
         FunctionProxy::GetFunctionNumber((FunctionProxy *)fieldAccessStats_local);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(pBVar1,(uint *)((long)&functionBodyWeakRef + 4),&local_28);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      Memory::Recycler::FindOrCreateWeakReferenceHandle<Js::FunctionBody>
                (this->recycler,(FunctionBody *)fieldAccessStats_local,&local_38);
      pRVar5 = this->recycler;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&FieldAccessStatsEntry::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                 ,0x19b1);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_60);
      local_70 = Memory::Recycler::AllocInlined;
      local_68 = 0;
      this_00 = (FieldAccessStatsEntry *)new<Memory::Recycler>(0x20,pRVar5,0x43c4b0);
      FieldAccessStatsEntry::FieldAccessStatsEntry(this_00,local_38,this->recycler);
      pBVar1 = this->fieldAccessStatsByFunctionNumber;
      local_28 = this_00;
      local_74 = FunctionProxy::GetFunctionNumber((FunctionProxy *)fieldAccessStats_local);
      JsUtil::
      BaseDictionary<unsigned_int,_Js::ScriptContext::FieldAccessStatsEntry_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew(pBVar1,&local_74,&local_28);
    }
    SList<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::Prepend
              (&local_28->stats,(FieldAccessStats **)&entry);
  }
  return;
}

Assistant:

void ScriptContext::RecordFieldAccessStats(FunctionBody* functionBody, FieldAccessStatsPtr fieldAccessStats)
    {
        Assert(fieldAccessStats != nullptr);

        if (!PHASE_STATS1(Js::ObjTypeSpecPhase))
        {
            return;
        }

        FieldAccessStatsEntry* entry;
        if (!this->fieldAccessStatsByFunctionNumber->TryGetValue(functionBody->GetFunctionNumber(), &entry))
        {
            RecyclerWeakReference<FunctionBody>* functionBodyWeakRef;
            this->recycler->FindOrCreateWeakReferenceHandle(functionBody, &functionBodyWeakRef);
            entry = RecyclerNew(this->recycler, FieldAccessStatsEntry, functionBodyWeakRef, this->recycler);

            this->fieldAccessStatsByFunctionNumber->AddNew(functionBody->GetFunctionNumber(), entry);
        }

        entry->stats.Prepend(fieldAccessStats);
    }